

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

bool __thiscall
ylt::detail::moodycamel::
ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
::
inner_enqueue<(ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0,std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>>
          (ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
           *this,unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                 *element)

{
  bool bVar1;
  ImplicitProducer *this_00;
  
  this_00 = ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
            ::get_or_add_implicit_producer
                      ((ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
                        *)this);
  if (this_00 != (ImplicitProducer *)0x0) {
    bVar1 = ImplicitProducer::
            enqueue<(ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0,std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>>
                      ((ImplicitProducer *)this_00,element);
    return bVar1;
  }
  return false;
}

Assistant:

inline bool inner_enqueue(U&& element) {
    auto producer = get_or_add_implicit_producer();
    return producer == nullptr
               ? false
               : producer->ConcurrentQueue::ImplicitProducer::template enqueue<
                     canAlloc>(std::forward<U>(element));
  }